

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int store_bits_MSB(cram_block *block,uint val,int nbits)

{
  int *piVar1;
  ulong uVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  uchar *puVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  
  uVar2 = block->alloc;
  if (block->byte + 4 < uVar2) {
LAB_00142d62:
    iVar8 = block->bit;
    iVar5 = iVar8 + 1;
    puVar6 = block->data;
    sVar3 = block->byte;
    cVar4 = (char)iVar5;
    if (iVar5 < nbits) {
      bVar7 = (char)nbits - cVar4;
      puVar6[sVar3] = puVar6[sVar3] | (byte)(val >> (bVar7 & 0x1f));
      block->bit = 7;
      sVar3 = block->byte;
      uVar9 = 1 << (bVar7 - 1 & 0x1f);
      block->byte = sVar3 + 1;
      block->data[sVar3 + 1] = '\0';
      iVar5 = (iVar8 - nbits) + 1;
      do {
        if ((uVar9 & val) != 0) {
          block->data[block->byte] =
               block->data[block->byte] | (byte)(1 << ((byte)block->bit & 0x1f));
        }
        piVar1 = &block->bit;
        iVar8 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar8 == 0) {
          block->bit = 7;
          sVar3 = block->byte;
          block->byte = sVar3 + 1;
          block->data[sVar3 + 1] = '\0';
        }
        uVar9 = uVar9 >> 1;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
      iVar5 = 0;
    }
    else {
      puVar6[sVar3] = puVar6[sVar3] | (byte)(val << (cVar4 - (char)nbits & 0x1fU));
      iVar8 = block->bit - nbits;
      block->bit = iVar8;
      iVar5 = 0;
      if (iVar8 == -1) {
        block->bit = 7;
        sVar3 = block->byte;
        block->byte = sVar3 + 1;
        block->data[sVar3 + 1] = '\0';
      }
    }
  }
  else {
    if (block->byte == 0) {
      block->alloc = 0x400;
      puVar6 = (uchar *)realloc(block->data,0x404);
      block->data = puVar6;
      if (puVar6 != (uchar *)0x0) {
        *puVar6 = '\0';
        goto LAB_00142d62;
      }
    }
    else {
      block->alloc = uVar2 * 2;
      puVar6 = (uchar *)realloc(block->data,uVar2 * 2 + 4);
      block->data = puVar6;
      if (puVar6 != (uchar *)0x0) goto LAB_00142d62;
    }
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int store_bits_MSB(cram_block *block, unsigned int val, int nbits) {
    /* fprintf(stderr, " store_bits: %02x %d\n", val, nbits); */

    /*
     * Use slow mode until we tweak the huffman generator to never generate
     * codes longer than 24-bits.
     */
    unsigned int mask;

    if (block->byte+4 >= block->alloc) {
	if (block->byte) {
	    block->alloc *= 2;
	    block->data = realloc(block->data, block->alloc + 4);
	    if (!block->data)
		return -1;
	} else {
	    block->alloc = 1024;
	    block->data = realloc(block->data, block->alloc + 4);
	    if (!block->data)
		return -1;
	    block->data[0] = 0; // initialise first byte of buffer
	}
    }

    /* fits in current bit-field */
    if (nbits <= block->bit+1) {
	block->data[block->byte] |= (val << (block->bit+1-nbits));
	if ((block->bit-=nbits) == -1) {
	    block->bit = 7;
	    block->byte++;
	    block->data[block->byte] = 0;
	}
	return 0;
    }

    block->data[block->byte] |= (val >> (nbits -= block->bit+1));
    block->bit = 7;
    block->byte++;
    block->data[block->byte] = 0;
				 
    mask = 1<<(nbits-1);
    do {
	if (val & mask)
	    block->data[block->byte] |= (1 << block->bit);
	if (--block->bit == -1) {
	    block->bit = 7;
	    block->byte++;
	    block->data[block->byte] = 0;
	}
	mask >>= 1;
    } while(--nbits);

    return 0;
}